

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_52dd::TlbExportVisitor::visit_(TlbExportVisitor *this,NullType *type)

{
  ostream *poVar1;
  Type *type_00;
  string sStack_68;
  string local_48;
  
  poVar1 = std::operator<<(this->m_stream,"<null ");
  poVar1 = std::operator<<(poVar1," name=\"");
  Typelib::Type::getName_abi_cxx11_();
  poVar1 = std::operator<<(poVar1,(string *)&sStack_68);
  poVar1 = std::operator<<(poVar1,"\" ");
  (anonymous_namespace)::TlbExportVisitor::emitSourceID_abi_cxx11_(&local_48,this);
  poVar1 = std::operator<<(poVar1,(string *)&local_48);
  std::operator<<(poVar1,">\n");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&sStack_68);
  poVar1 = std::operator<<(this->m_stream,(string *)&this->m_indent);
  (anonymous_namespace)::TlbExportVisitor::emitMetaData_abi_cxx11_(&sStack_68,type,type_00);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_68);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&sStack_68);
  poVar1 = std::operator<<(this->m_stream,(string *)&this->m_indent);
  std::operator<<(poVar1,"</null>");
  return true;
}

Assistant:

bool TlbExportVisitor::visit_ (NullType const& type)
    {
        m_stream << "<null " << " name=\"" << type.getName() << "\" " << emitSourceID() << ">\n";
        m_stream << m_indent << emitMetaData(type) << "\n";
        m_stream << m_indent << "</null>";
        return true;
    }